

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O1

void __thiscall QFont::setOverline(QFont *this,bool enable)

{
  QFontPrivate *pQVar1;
  
  if (((this->resolve_mask & 0x80) == 0) || (((((this->d).d.ptr)->field_0x7c & 2) == 0) == enable))
  {
    QFontPrivate::detachButKeepEngineData(this);
    pQVar1 = (this->d).d.ptr;
    pQVar1->field_0x7c = pQVar1->field_0x7c & 0xfd | enable * '\x02';
    *(byte *)&this->resolve_mask = (byte)this->resolve_mask | 0x80;
  }
  return;
}

Assistant:

void QFont::setOverline(bool enable)
{
    if ((resolve_mask & QFont::OverlineResolved) && d->overline == enable)
        return;

    QFontPrivate::detachButKeepEngineData(this);

    d->overline = enable;
    resolve_mask |= QFont::OverlineResolved;
}